

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O1

nghttp3_ssize
nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,uint8_t *src,size_t srclen)

{
  nghttp3_qpack_read_state *rstate;
  uint64_t *puVar1;
  nghttp3_rcbuf *pnVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  size_t sVar8;
  ulong n;
  byte *end;
  nghttp3_ssize nVar9;
  byte *src_00;
  int rfin;
  int local_64;
  nghttp3_buf *local_60;
  nghttp3_buf *local_58;
  nghttp3_rcbuf **local_50;
  uint64_t *local_48;
  nghttp3_mem *local_40;
  nghttp3_rcbuf **local_38;
  
  nVar9 = -0x6c;
  if ((decoder->ctx).bad == '\0') {
    if (srclen == 0) {
      nVar9 = 0;
    }
    else {
      local_40 = (decoder->ctx).mem;
      uVar6 = decoder->uninterrupted_encoderlen + srclen;
      decoder->uninterrupted_encoderlen = uVar6;
      nVar9 = -0x192;
      if (uVar6 < 0x20001) {
        end = src + srclen;
        local_48 = &(decoder->rstate).left;
        local_58 = &(decoder->rstate).valuebuf;
        local_50 = &(decoder->rstate).name;
        local_60 = &(decoder->rstate).namebuf;
        rstate = &decoder->rstate;
        local_38 = &(decoder->rstate).value;
        src_00 = src;
LAB_00108c73:
        switch(decoder->state) {
        case NGHTTP3_QPACK_ES_STATE_OPCODE:
          nVar9 = (*(code *)(&DAT_00114d34 + *(int *)(&DAT_00114d34 + (ulong)(*src_00 >> 5) * 4)))()
          ;
          return nVar9;
        case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
          nVar9 = qpack_read_varint(&local_64,rstate,src_00,end);
          if (nVar9 < 0) {
            n = 0xfffffe6e;
            if (nVar9 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb2e,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
          }
          else {
            src_00 = src_00 + nVar9;
            if (local_64 == 0) goto LAB_00109180;
            if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
              iVar4 = nghttp3_qpack_decoder_set_max_dtable_capacity(decoder,(decoder->rstate).left);
              if (iVar4 == 0) goto LAB_00109005;
              n = 0xfffffe6e;
            }
            else {
              uVar5 = nghttp3_qpack_decoder_rel2abs(decoder,rstate);
              if (-1 < (int)uVar5) {
                if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
                  (decoder->rstate).prefix = 7;
                  decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
                  goto switchD_00108c8e_default;
                }
                if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_DUPLICATE) {
                  nghttp3_unreachable_fail
                            ("nghttp3_qpack.c",0xb5e,"nghttp3_qpack_decoder_read_encoder");
                }
                uVar5 = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
                if (uVar5 == 0) goto LAB_00109005;
              }
              n = (ulong)uVar5;
            }
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
          (decoder->rstate).huffman_encoded =
               (uint)((*src_00 >> ((uint)(decoder->rstate).prefix & 0x1f) & 1) != 0);
          decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
          (decoder->rstate).left = 0;
          (decoder->rstate).shift = 0;
        case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
          nVar9 = qpack_read_varint(&local_64,rstate,src_00,end);
          if (nVar9 < 0) {
            n = 0xfffffe6e;
            if (nVar9 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb6b,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            break;
          }
          src_00 = src_00 + nVar9;
          if (local_64 == 0) goto LAB_00109180;
          uVar6 = (decoder->rstate).left;
          if (0x100 < uVar6) {
LAB_00109190:
            n = 0xffffff93;
            break;
          }
          if ((decoder->rstate).huffman_encoded == 0) {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
          }
          else {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
            nghttp3_qpack_huffman_decode_context_init(&rstate->huffman_ctx);
            uVar6 = (decoder->rstate).left * 2;
          }
          uVar5 = nghttp3_rcbuf_new(local_50,uVar6 + 1,local_40);
          n = (ulong)uVar5;
          if (uVar5 != 0) break;
          pnVar2 = (decoder->rstate).name;
          nghttp3_buf_wrap_init(local_60,pnVar2->base,pnVar2->len);
switchD_00108c8e_default:
          bVar3 = false;
LAB_00109172:
          if (src_00 == end && !bVar3) {
LAB_00109180:
            return (long)src_00 - (long)src;
          }
          goto LAB_00108c73;
        case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
          sVar8 = qpack_read_huffman_string(rstate,local_60,src_00,end);
          if (-1 < (long)sVar8) {
LAB_00108f48:
            src_00 = src_00 + sVar8;
            if ((decoder->rstate).left == 0) {
              *(decoder->rstate).namebuf.last = '\0';
              sVar8 = nghttp3_buf_len(local_60);
              ((decoder->rstate).name)->len = sVar8;
              decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
              (decoder->rstate).prefix = 7;
              goto switchD_00108c8e_default;
            }
            goto LAB_00109180;
          }
          n = 0xfffffe6e;
          if (sVar8 != 0xffffffffffffff94) {
            __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                          "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                          ,0xb91,
                          "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                         );
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_NAME:
          uVar6 = (decoder->rstate).left;
          n = (long)end - (long)src_00;
          if (uVar6 <= (ulong)((long)end - (long)src_00)) {
            n = uVar6;
          }
          puVar7 = nghttp3_cpymem((decoder->rstate).namebuf.last,src_00,n);
          (decoder->rstate).namebuf.last = puVar7;
          puVar1 = &(decoder->rstate).left;
          *puVar1 = *puVar1 - n;
          sVar8 = n;
          if (-1 < (long)n) goto LAB_00108f48;
          break;
        case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
          (decoder->rstate).huffman_encoded =
               (uint)((*src_00 >> ((uint)(decoder->rstate).prefix & 0x1f) & 1) != 0);
          decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
          (decoder->rstate).left = 0;
          (decoder->rstate).shift = 0;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
          nVar9 = qpack_read_varint(&local_64,rstate,src_00,end);
          if (nVar9 < 0) {
            n = 0xfffffe6e;
            if (nVar9 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbbd,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            break;
          }
          src_00 = src_00 + nVar9;
          if (local_64 != 0) {
            uVar6 = (decoder->rstate).left;
            if (0x10000 < uVar6) goto LAB_00109190;
            if ((decoder->rstate).huffman_encoded == 0) {
              decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
            }
            else {
              decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
              nghttp3_qpack_huffman_decode_context_init(&rstate->huffman_ctx);
              uVar6 = (decoder->rstate).left * 2;
            }
            uVar5 = nghttp3_rcbuf_new(local_38,uVar6 + 1,local_40);
            n = (ulong)uVar5;
            if (uVar5 != 0) break;
            pnVar2 = (decoder->rstate).value;
            nghttp3_buf_wrap_init(local_58,pnVar2->base,pnVar2->len);
            bVar3 = true;
            goto LAB_00109172;
          }
          goto LAB_00109180;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
          nVar9 = qpack_read_huffman_string(rstate,local_58,src_00,end);
          if (nVar9 < 0) {
            n = 0xfffffe6e;
            if (nVar9 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbe6,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
          }
          else {
            src_00 = src_00 + nVar9;
            if ((decoder->rstate).left != 0) goto LAB_00109180;
            *(decoder->rstate).valuebuf.last = '\0';
            sVar8 = nghttp3_buf_len(local_58);
            ((decoder->rstate).value)->len = sVar8;
            if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT) {
              if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
                nghttp3_unreachable_fail
                          ("nghttp3_qpack.c",0xbfb,"nghttp3_qpack_decoder_read_encoder");
              }
              goto LAB_00108fe8;
            }
LAB_00108ff2:
            uVar5 = nghttp3_qpack_decoder_dtable_literal_add(decoder);
LAB_00108ffa:
            n = (ulong)uVar5;
            if (uVar5 == 0) {
LAB_00109005:
              decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
              *local_50 = (nghttp3_rcbuf *)0x0;
              local_50[1] = (nghttp3_rcbuf *)0x0;
              nghttp3_buf_init(local_60);
              nghttp3_buf_init(local_58);
              *(undefined8 *)((long)local_48 + 0x1c) = 0;
              *(undefined8 *)((long)local_48 + 0x24) = 0;
              local_48[2] = 0;
              local_48[3] = 0;
              *local_48 = 0;
              local_48[1] = 0;
              goto switchD_00108c8e_default;
            }
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
          uVar6 = (decoder->rstate).left;
          n = (long)end - (long)src_00;
          if (uVar6 <= (ulong)((long)end - (long)src_00)) {
            n = uVar6;
          }
          puVar7 = nghttp3_cpymem((decoder->rstate).valuebuf.last,src_00,n);
          (decoder->rstate).valuebuf.last = puVar7;
          puVar1 = &(decoder->rstate).left;
          *puVar1 = *puVar1 - n;
          if (-1 < (long)n) {
            src_00 = src_00 + n;
            if ((decoder->rstate).left == 0) {
              *(decoder->rstate).valuebuf.last = '\0';
              sVar8 = nghttp3_buf_len(local_58);
              ((decoder->rstate).value)->len = sVar8;
              if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_INSERT) goto LAB_00108ff2;
              if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
                nghttp3_unreachable_fail
                          ("nghttp3_qpack.c",0xc1c,"nghttp3_qpack_decoder_read_encoder");
              }
LAB_00108fe8:
              uVar5 = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
              goto LAB_00108ffa;
            }
            goto LAB_00109180;
          }
          break;
        default:
          goto switchD_00108c8e_default;
        }
        (decoder->ctx).bad = '\x01';
        nVar9 = (nghttp3_ssize)(int)n;
      }
    }
  }
  return nVar9;
}

Assistant:

nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,
                                                 const uint8_t *src,
                                                 size_t srclen) {
  const uint8_t *p = src, *end;
  int rv;
  int busy = 0;
  const nghttp3_mem *mem = decoder->ctx.mem;
  nghttp3_ssize nread;
  int rfin;

  if (decoder->ctx.bad) {
    return NGHTTP3_ERR_QPACK_FATAL;
  }

  if (srclen == 0) {
    return 0;
  }

  decoder->uninterrupted_encoderlen += srclen;
  if (decoder->uninterrupted_encoderlen > NGHTTP3_QPACK_MAX_ENCODERLEN) {
    return NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
  }

  end = src + srclen;

  for (; p != end || busy;) {
    busy = 0;
    switch (decoder->state) {
    case NGHTTP3_QPACK_ES_STATE_OPCODE:
      switch ((*p) & 0xe0) {
      case 0x80:
      case 0xa0:
      case 0xc0:
      case 0xe0:
        DEBUGF("qpack::decode: OPCODE_INSERT_INDEXED\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED;
        decoder->rstate.dynamic = !((*p) & 0x40);
        decoder->rstate.prefix = 6;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      case 0x40:
      case 0x60:
        DEBUGF("qpack::decode: OPCODE_INSERT\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT;
        decoder->rstate.dynamic = 0;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN;

        break;
      case 0x20:
        DEBUGF("qpack::decode: OPCODE_SET_DTABLE_TABLE_CAP\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      default:
        DEBUGF("qpack::decode: OPCODE_DUPLICATE\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_DUPLICATE;
        decoder->rstate.dynamic = 1;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;
      }
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
        DEBUGF("qpack::decode: Set dtable capacity to %" PRIu64 "\n",
               decoder->rstate.left);
        rv = nghttp3_qpack_decoder_set_max_dtable_capacity(
          decoder, (size_t)decoder->rstate.left);
        if (rv != 0) {
          rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);
        break;
      }

      rv = nghttp3_qpack_decoder_rel2abs(decoder, &decoder->rstate);
      if (rv < 0) {
        goto fail;
      }

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_DUPLICATE:
        rv = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
        if (rv != 0) {
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);

        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        decoder->rstate.prefix = 7;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;

        break;
      default:
        nghttp3_unreachable();
      }

      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_NAMELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.namebuf,
                            decoder->rstate.name->base,
                            decoder->rstate.name->len);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_VALUELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.valuebuf,
                            decoder->rstate.value->base,
                            decoder->rstate.value->len);

      /* value might be 0 length */
      busy = 1;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    }
  }

  return p - src;

fail:
  decoder->ctx.bad = 1;
  return rv;
}